

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O1

int __thiscall
bdConnection::ConnectionSetup
          (bdConnection *this,bdId *proxyId,bdId *srcConnAddr,bdId *destId,int mode,int delay)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  sa_family_t sVar4;
  in_port_t iVar5;
  in_addr iVar6;
  time_t tVar7;
  
  this->mState = 3;
  tVar7 = time((time_t *)0x0);
  this->mLastEvent = tVar7;
  *(undefined4 *)((this->mSrcId).id.data + 0x10) = *(undefined4 *)((srcConnAddr->id).data + 0x10);
  sVar4 = (srcConnAddr->addr).sin_family;
  iVar5 = (srcConnAddr->addr).sin_port;
  iVar6.s_addr = (srcConnAddr->addr).sin_addr.s_addr;
  uVar1 = *(undefined8 *)(srcConnAddr->addr).sin_zero;
  uVar2 = *(undefined8 *)((srcConnAddr->id).data + 8);
  *(undefined8 *)(this->mSrcId).id.data = *(undefined8 *)(srcConnAddr->id).data;
  *(undefined8 *)((this->mSrcId).id.data + 8) = uVar2;
  (this->mSrcId).addr.sin_family = sVar4;
  (this->mSrcId).addr.sin_port = iVar5;
  (this->mSrcId).addr.sin_addr = (in_addr)iVar6.s_addr;
  *(undefined8 *)(this->mSrcId).addr.sin_zero = uVar1;
  iVar5 = (destId->addr).sin_port;
  iVar6.s_addr = (destId->addr).sin_addr.s_addr;
  uVar1 = *(undefined8 *)(destId->addr).sin_zero;
  uVar2 = *(undefined8 *)(destId->id).data;
  uVar3 = *(undefined8 *)((destId->id).data + 8);
  (this->mDestId).addr.sin_family = (destId->addr).sin_family;
  (this->mDestId).addr.sin_port = iVar5;
  (this->mDestId).addr.sin_addr = (in_addr)iVar6.s_addr;
  *(undefined8 *)(this->mDestId).addr.sin_zero = uVar1;
  *(undefined8 *)(this->mDestId).id.data = uVar2;
  *(undefined8 *)((this->mDestId).id.data + 8) = uVar3;
  *(undefined4 *)((this->mDestId).id.data + 0x10) = *(undefined4 *)((destId->id).data + 0x10);
  sVar4 = (proxyId->addr).sin_family;
  iVar5 = (proxyId->addr).sin_port;
  iVar6.s_addr = (proxyId->addr).sin_addr.s_addr;
  uVar1 = *(undefined8 *)(proxyId->addr).sin_zero;
  uVar2 = *(undefined8 *)((proxyId->id).data + 8);
  *(undefined8 *)(this->mProxyId).id.data = *(undefined8 *)(proxyId->id).data;
  *(undefined8 *)((this->mProxyId).id.data + 8) = uVar2;
  *(undefined4 *)((this->mProxyId).id.data + 0x10) = *(undefined4 *)((proxyId->id).data + 0x10);
  (this->mProxyId).addr.sin_family = sVar4;
  (this->mProxyId).addr.sin_port = iVar5;
  (this->mProxyId).addr.sin_addr = (in_addr)iVar6.s_addr;
  *(undefined8 *)(this->mProxyId).addr.sin_zero = uVar1;
  this->mPoint = 1;
  this->mMode = mode;
  *(undefined4 *)((this->mSrcConnAddr).id.data + 0x10) =
       *(undefined4 *)((srcConnAddr->id).data + 0x10);
  sVar4 = (srcConnAddr->addr).sin_family;
  iVar5 = (srcConnAddr->addr).sin_port;
  iVar6.s_addr = (srcConnAddr->addr).sin_addr.s_addr;
  uVar1 = *(undefined8 *)(srcConnAddr->addr).sin_zero;
  uVar2 = *(undefined8 *)((srcConnAddr->id).data + 8);
  *(undefined8 *)(this->mSrcConnAddr).id.data = *(undefined8 *)(srcConnAddr->id).data;
  *(undefined8 *)((this->mSrcConnAddr).id.data + 8) = uVar2;
  (this->mSrcConnAddr).addr.sin_family = sVar4;
  (this->mSrcConnAddr).addr.sin_port = iVar5;
  (this->mSrcConnAddr).addr.sin_addr = (in_addr)iVar6.s_addr;
  *(undefined8 *)(this->mSrcConnAddr).addr.sin_zero = uVar1;
  iVar5 = (destId->addr).sin_port;
  iVar6.s_addr = (destId->addr).sin_addr.s_addr;
  uVar1 = *(undefined8 *)(destId->addr).sin_zero;
  uVar2 = *(undefined8 *)(destId->id).data;
  uVar3 = *(undefined8 *)((destId->id).data + 8);
  (this->mDestConnAddr).addr.sin_family = (destId->addr).sin_family;
  (this->mDestConnAddr).addr.sin_port = iVar5;
  (this->mDestConnAddr).addr.sin_addr = (in_addr)iVar6.s_addr;
  *(undefined8 *)(this->mDestConnAddr).addr.sin_zero = uVar1;
  *(undefined8 *)(this->mDestConnAddr).id.data = uVar2;
  *(undefined8 *)((this->mDestConnAddr).id.data + 8) = uVar3;
  *(undefined4 *)((this->mDestConnAddr).id.data + 0x10) = *(undefined4 *)((destId->id).data + 0x10);
  this->mBandwidth = 0;
  this->mMaxDelay = delay;
  tVar7 = time((time_t *)0x0);
  this->mConnectionStartTS = tVar7;
  bdsockaddr_clear(&(this->mSrcId).addr);
  bdsockaddr_clear(&(this->mDestId).addr);
  bdsockaddr_clear(&(this->mDestConnAddr).addr);
  return 1;
}

Assistant:

int bdConnection::ConnectionSetup(bdId *proxyId, bdId *srcConnAddr, bdId *destId, int mode, int delay) {
	mState = BITDHT_CONNECTION_WAITING_START; /* or REPLY, no AUTH required */
	mLastEvent = time(NULL);
	mSrcId = *srcConnAddr;    /* self, IP unknown */
	mDestId = *destId;  /* dest, IP unknown */
	mProxyId =  *proxyId;  /* full proxy/dest address */

	mPoint = BD_PROXY_CONNECTION_START_POINT;
	mMode = mode;

	mSrcConnAddr = *srcConnAddr; /* self, full ID/IP */
	mDestConnAddr = *destId; /* IP unknown */

	mBandwidth = 0;
	mMaxDelay = delay;
	mConnectionStartTS = time(NULL);

#ifdef DEBUG_CONNECTION_DELAY
	std::cerr << "bdConnection::ConnectionSetup(): delay: " << mMaxDelay;
	std::cerr << std::endl;
#endif

	/* clear IP Addresses to enforce this */
	bdsockaddr_clear(&(mSrcId.addr)); 
	bdsockaddr_clear(&(mDestId.addr)); 
	bdsockaddr_clear(&(mDestConnAddr.addr)); 

	/* don't bother with START/ACK parameters */
	return 1;
}